

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadCircle(ON_BinaryArchive *this,ON_Circle *circle)

{
  bool bVar1;
  ON_3dPoint scratch;
  double adStack_28 [3];
  
  bVar1 = ReadPlane(this,&circle->plane);
  if (bVar1) {
    bVar1 = ReadDouble(this,1,&circle->radius);
  }
  if (bVar1 != false) {
    bVar1 = ReadDouble(this,3,adStack_28);
  }
  if (bVar1 != false) {
    bVar1 = ReadDouble(this,3,adStack_28);
  }
  if (bVar1 != false) {
    bVar1 = ReadDouble(this,3,adStack_28);
  }
  return bVar1;
}

Assistant:

bool 
ON_BinaryArchive::ReadCircle(ON_Circle& circle)
{
  ON_3dPoint scratch;
  bool rc = ReadPlane( circle.plane );
  if (rc)
    rc = ReadDouble( &circle.radius );
  // m_point[] removed 2001, November, 7
  if (rc)
    rc = ReadPoint( scratch );
  if (rc)
    rc = ReadPoint( scratch );
  if (rc)
    rc = ReadPoint( scratch );
  /*
  if (rc)
    rc = ReadPoint( circle.m_point[0] );
  if (rc)
    rc = ReadPoint( circle.m_point[1] );
  if (rc)
    rc = ReadPoint( circle.m_point[2] );
  */
  return rc;
}